

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1d382d4::AV1FwdTxfm2dTest_match_Test::TestBody(AV1FwdTxfm2dTest_match_Test *this)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 *puVar5;
  uint32_t uVar6;
  uint uVar7;
  ParamType *pPVar8;
  undefined1 *puVar9;
  size_t sVar10;
  int c;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int *rhs;
  ostream *poVar14;
  SEARCH_METHODS *message;
  ulong uVar15;
  int *lhs;
  ulong uVar16;
  char *__s;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  int iVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar40 [16];
  ACMRandom rnd;
  TxfmParam param;
  int16_t input [4096];
  int32_t ref_output [4096];
  int32_t output [4096];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a138;
  int local_a12c;
  ulong local_a128;
  AssertHelper local_a120;
  uint local_a114;
  uint local_a110;
  int local_a10c;
  uint local_a108;
  Random local_a104;
  ulong local_a100;
  ulong local_a0f8;
  internal local_a0f0 [8];
  undefined8 *local_a0e8;
  txfm_param local_a0e0;
  long local_a0c0;
  long local_a0b8;
  ulong local_a0b0;
  _func_void_short_ptr_int_ptr_int_txfm_param_ptr *local_a0a8;
  code *local_a0a0;
  int *local_a098;
  int *local_a090;
  long local_a088;
  ulong local_a080;
  ulong local_a078;
  undefined1 local_a070 [16];
  ushort local_a060 [448];
  undefined1 local_9ce0 [7296];
  int local_8060 [4096];
  int local_4060 [4108];
  
  pPVar8 = testing::
           WithParamInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
           ::GetParam();
  bVar1 = (pPVar8->
          super__Tuple_impl<0UL,_unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>).
          super__Head_base<0UL,_unsigned_char,_false>._M_head_impl;
  uVar15 = (ulong)bVar1;
  pPVar8 = testing::
           WithParamInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
           ::GetParam();
  local_a0a8 = (pPVar8->
               super__Tuple_impl<0UL,_unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>
               ).super__Tuple_impl<1UL,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>.
               super__Head_base<1UL,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*),_false>.
               _M_head_impl;
  local_a0e0.tx_type = '\0';
  local_a0e0.tx_size = '\0';
  local_a0e0._2_2_ = 0;
  local_a0e0.lossless = 0;
  local_a0e0.bd = 0;
  local_a0e0.is_hbd = 0;
  local_a0e0.tx_set_type = '\0';
  local_a0e0._17_3_ = 0;
  local_a0e0.eob = 0;
  uVar13 = (ulong)((uint)bVar1 * 4);
  local_a114 = *(uint *)((long)::tx_size_high + uVar13);
  local_a110 = *(uint *)((long)::tx_size_wide + uVar13);
  uVar13 = 0;
  iVar34 = (uint)((0x18608UL >> (uVar15 & 0x3f) & 1) == 0) * 4 + 1;
  if ((0x61810UL >> (uVar15 & 0x3f) & 1) != 0) {
    iVar34 = 0;
  }
  local_a108 = 0x20;
  if ((int)local_a110 < 0x20) {
    local_a108 = local_a110;
  }
  local_a10c = local_a110 * local_a114;
  uVar16 = 1;
  if (1 < (int)local_a110) {
    uVar16 = (ulong)local_a110;
  }
  local_a078 = 1;
  if (1 < (int)local_a114) {
    local_a078 = (ulong)local_a114;
  }
  local_a080 = 1;
  if (1 < (int)local_a108) {
    local_a080 = (ulong)local_a108;
  }
  lVar12 = local_a078 - 1;
  lVar11 = (long)av1_ext_tx_used[0] + (ulong)(uint)(iVar34 << 6);
  auVar21._8_4_ = (int)lVar12;
  auVar21._0_8_ = lVar12;
  auVar21._12_4_ = (int)((ulong)lVar12 >> 0x20);
  local_a088 = (ulong)((int)local_a078 + 7U & 0xfffffff8) << 7;
  local_a0b8 = (long)(int)local_a108 << 2;
  local_a070 = auVar21 ^ _DAT_00bfdd80;
  local_a100 = uVar15;
  local_a0c0 = lVar11;
  do {
    if (*(int *)(lVar11 + uVar13 * 4) != 0) {
      local_a0a0 = *(code **)(libaom_test::fwd_txfm_func_ls + local_a100 * 8);
      memset(local_a060,0,0x2000);
      local_a104.state_ = 0xbaba;
      local_a128 = uVar13;
      iVar34 = 0;
      do {
        local_a12c = iVar34;
        if (local_a12c == 0) {
          puVar9 = local_9ce0;
          uVar13 = 0;
          do {
            lVar12 = 0;
            auVar17 = _DAT_00c0d0d0;
            auVar18 = _DAT_00c0d0c0;
            auVar19 = _DAT_00c0d0b0;
            auVar20 = _DAT_00c0d0a0;
            do {
              auVar21 = auVar17 ^ _DAT_00bfdd80;
              iVar34 = -(uint)((int)local_a070._0_4_ < auVar21._0_4_);
              auVar22._4_4_ = -(uint)((int)local_a070._4_4_ < auVar21._4_4_);
              iVar37 = -(uint)((int)local_a070._8_4_ < auVar21._8_4_);
              auVar22._12_4_ = -(uint)((int)local_a070._12_4_ < auVar21._12_4_);
              auVar30._4_4_ = iVar34;
              auVar30._0_4_ = iVar34;
              auVar30._8_4_ = iVar37;
              auVar30._12_4_ = iVar37;
              auVar38 = pshuflw(in_XMM7,auVar30,0xe8);
              auVar24._4_4_ = -(uint)(auVar21._4_4_ == local_a070._4_4_);
              auVar24._12_4_ = -(uint)(auVar21._12_4_ == local_a070._12_4_);
              auVar24._0_4_ = auVar24._4_4_;
              auVar24._8_4_ = auVar24._12_4_;
              auVar40 = pshuflw(in_XMM8,auVar24,0xe8);
              auVar22._0_4_ = auVar22._4_4_;
              auVar22._8_4_ = auVar22._12_4_;
              auVar21 = pshuflw(auVar38,auVar22,0xe8);
              auVar39._8_4_ = 0xffffffff;
              auVar39._0_8_ = 0xffffffffffffffff;
              auVar39._12_4_ = 0xffffffff;
              auVar39 = (auVar21 | auVar40 & auVar38) ^ auVar39;
              auVar21 = packssdw(auVar39,auVar39);
              if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar9 + lVar12 + -0x380) = 0xff;
              }
              auVar22 = auVar24 & auVar30 | auVar22;
              auVar21 = packssdw(auVar22,auVar22);
              auVar2._8_4_ = 0xffffffff;
              auVar2._0_8_ = 0xffffffffffffffff;
              auVar2._12_4_ = 0xffffffff;
              auVar21 = packssdw(auVar21 ^ auVar2,auVar21 ^ auVar2);
              if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
                *(undefined2 *)(puVar9 + lVar12 + -0x300) = 0xff;
              }
              auVar21 = auVar18 ^ _DAT_00bfdd80;
              iVar34 = -(uint)((int)local_a070._0_4_ < auVar21._0_4_);
              auVar35._4_4_ = -(uint)((int)local_a070._4_4_ < auVar21._4_4_);
              iVar37 = -(uint)((int)local_a070._8_4_ < auVar21._8_4_);
              auVar35._12_4_ = -(uint)((int)local_a070._12_4_ < auVar21._12_4_);
              auVar23._4_4_ = iVar34;
              auVar23._0_4_ = iVar34;
              auVar23._8_4_ = iVar37;
              auVar23._12_4_ = iVar37;
              auVar31._4_4_ = -(uint)(auVar21._4_4_ == local_a070._4_4_);
              auVar31._12_4_ = -(uint)(auVar21._12_4_ == local_a070._12_4_);
              auVar31._0_4_ = auVar31._4_4_;
              auVar31._8_4_ = auVar31._12_4_;
              auVar35._0_4_ = auVar35._4_4_;
              auVar35._8_4_ = auVar35._12_4_;
              auVar21 = auVar31 & auVar23 | auVar35;
              auVar21 = packssdw(auVar21,auVar21);
              auVar3._8_4_ = 0xffffffff;
              auVar3._0_8_ = 0xffffffffffffffff;
              auVar3._12_4_ = 0xffffffff;
              auVar21 = packssdw(auVar21 ^ auVar3,auVar21 ^ auVar3);
              if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar9 + lVar12 + -0x280) = 0xff;
              }
              auVar39 = pshufhw(auVar23,auVar23,0x84);
              auVar22 = pshufhw(auVar31,auVar31,0x84);
              auVar24 = pshufhw(auVar39,auVar35,0x84);
              auVar25._8_4_ = 0xffffffff;
              auVar25._0_8_ = 0xffffffffffffffff;
              auVar25._12_4_ = 0xffffffff;
              auVar25 = (auVar24 | auVar22 & auVar39) ^ auVar25;
              auVar39 = packssdw(auVar25,auVar25);
              if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar9 + lVar12 + -0x200) = 0xff;
              }
              auVar39 = auVar19 ^ _DAT_00bfdd80;
              iVar34 = -(uint)((int)local_a070._0_4_ < auVar39._0_4_);
              auVar27._4_4_ = -(uint)((int)local_a070._4_4_ < auVar39._4_4_);
              iVar37 = -(uint)((int)local_a070._8_4_ < auVar39._8_4_);
              auVar27._12_4_ = -(uint)((int)local_a070._12_4_ < auVar39._12_4_);
              auVar32._4_4_ = iVar34;
              auVar32._0_4_ = iVar34;
              auVar32._8_4_ = iVar37;
              auVar32._12_4_ = iVar37;
              auVar21 = pshuflw(auVar21,auVar32,0xe8);
              auVar26._4_4_ = -(uint)(auVar39._4_4_ == local_a070._4_4_);
              auVar26._12_4_ = -(uint)(auVar39._12_4_ == local_a070._12_4_);
              auVar26._0_4_ = auVar26._4_4_;
              auVar26._8_4_ = auVar26._12_4_;
              in_XMM8 = pshuflw(auVar40 & auVar38,auVar26,0xe8);
              in_XMM8 = in_XMM8 & auVar21;
              auVar27._0_4_ = auVar27._4_4_;
              auVar27._8_4_ = auVar27._12_4_;
              auVar21 = pshuflw(auVar21,auVar27,0xe8);
              auVar38._8_4_ = 0xffffffff;
              auVar38._0_8_ = 0xffffffffffffffff;
              auVar38._12_4_ = 0xffffffff;
              auVar38 = (auVar21 | in_XMM8) ^ auVar38;
              auVar21 = packssdw(auVar38,auVar38);
              if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar9 + lVar12 + -0x180) = 0xff;
              }
              auVar27 = auVar26 & auVar32 | auVar27;
              auVar21 = packssdw(auVar27,auVar27);
              auVar40._8_4_ = 0xffffffff;
              auVar40._0_8_ = 0xffffffffffffffff;
              auVar40._12_4_ = 0xffffffff;
              auVar21 = packssdw(auVar21 ^ auVar40,auVar21 ^ auVar40);
              if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar9 + lVar12 + -0x100) = 0xff;
              }
              auVar21 = auVar20 ^ _DAT_00bfdd80;
              iVar34 = -(uint)((int)local_a070._0_4_ < auVar21._0_4_);
              auVar36._4_4_ = -(uint)((int)local_a070._4_4_ < auVar21._4_4_);
              iVar37 = -(uint)((int)local_a070._8_4_ < auVar21._8_4_);
              auVar36._12_4_ = -(uint)((int)local_a070._12_4_ < auVar21._12_4_);
              auVar28._4_4_ = iVar34;
              auVar28._0_4_ = iVar34;
              auVar28._8_4_ = iVar37;
              auVar28._12_4_ = iVar37;
              auVar33._4_4_ = -(uint)(auVar21._4_4_ == local_a070._4_4_);
              auVar33._12_4_ = -(uint)(auVar21._12_4_ == local_a070._12_4_);
              auVar33._0_4_ = auVar33._4_4_;
              auVar33._8_4_ = auVar33._12_4_;
              auVar36._0_4_ = auVar36._4_4_;
              auVar36._8_4_ = auVar36._12_4_;
              auVar21 = auVar33 & auVar28 | auVar36;
              auVar21 = packssdw(auVar21,auVar21);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              in_XMM7 = packssdw(auVar21 ^ auVar4,auVar21 ^ auVar4);
              if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar9 + lVar12 + -0x80) = 0xff;
              }
              auVar21 = pshufhw(auVar28,auVar28,0x84);
              auVar24 = pshufhw(auVar33,auVar33,0x84);
              auVar39 = pshufhw(auVar21,auVar36,0x84);
              auVar29._8_4_ = 0xffffffff;
              auVar29._0_8_ = 0xffffffffffffffff;
              auVar29._12_4_ = 0xffffffff;
              auVar29 = (auVar39 | auVar24 & auVar21) ^ auVar29;
              auVar21 = packssdw(auVar29,auVar29);
              if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar9 + lVar12) = 0xff;
              }
              lVar11 = auVar17._8_8_;
              auVar17._0_8_ = auVar17._0_8_ + 8;
              auVar17._8_8_ = lVar11 + 8;
              lVar11 = auVar18._8_8_;
              auVar18._0_8_ = auVar18._0_8_ + 8;
              auVar18._8_8_ = lVar11 + 8;
              lVar11 = auVar19._8_8_;
              auVar19._0_8_ = auVar19._0_8_ + 8;
              auVar19._8_8_ = lVar11 + 8;
              lVar11 = auVar20._8_8_;
              auVar20._0_8_ = auVar20._0_8_ + 8;
              auVar20._8_8_ = lVar11 + 8;
              lVar12 = lVar12 + 0x400;
            } while (local_a088 != lVar12);
            uVar13 = uVar13 + 1;
            puVar9 = puVar9 + 2;
          } while (uVar13 != uVar16);
        }
        else {
          uVar13 = 0;
          do {
            uVar15 = 0;
            do {
              uVar6 = testing::internal::Random::Generate(&local_a104,0x80000000);
              local_a060[(ulong)((uint)uVar13 & 0x3ffffff) * 0x40 + uVar15] =
                   (ushort)(uVar6 >> 0xf) & 0xff;
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
            uVar13 = uVar13 + 1;
          } while (uVar13 != local_a078);
        }
        local_a0e0.tx_size = (TX_SIZE)local_a100;
        local_a0e0.tx_type = (TX_TYPE)local_a128;
        local_a0e0.tx_set_type = '\x05';
        local_a0e0.bd = 8;
        (*local_a0a0)(local_a060,local_8060,0x40,local_a128 & 0xff,8);
        (*local_a0a8)((short *)local_a060,local_4060,0x40,&local_a0e0);
        uVar7 = (uint)((long)local_a10c / (long)(int)local_a108);
        if (0 < (int)uVar7) {
          local_a0b0 = (long)local_a10c / (long)(int)local_a108 & 0xffffffff;
          if (0x1f < uVar7) {
            local_a0b0 = 0x20;
          }
          lhs = local_8060;
          rhs = local_4060;
          uVar13 = 0;
          do {
            uVar15 = 0;
            local_a0f8 = uVar13;
            local_a098 = rhs;
            local_a090 = lhs;
            do {
              testing::internal::CmpHelperEQ<int,int>
                        (local_a0f0,"ref_output[r * check_cols + c]","output[r * check_cols + c]",
                         lhs,rhs);
              puVar5 = local_a0e8;
              if (local_a0f0[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_a138);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_a138._M_head_impl + 0x10),"[",1);
                uVar13 = local_a128;
                std::ostream::operator<<(local_a138._M_head_impl + 0x10,(int)local_a0f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_a138._M_head_impl + 0x10),",",1);
                std::ostream::operator<<(local_a138._M_head_impl + 0x10,(int)uVar15);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_a138._M_head_impl + 0x10),"] cnt:",6);
                std::ostream::operator<<(local_a138._M_head_impl + 0x10,local_a12c);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_a138._M_head_impl + 0x10)," tx_size: ",10);
                std::ostream::operator<<(local_a138._M_head_impl + 0x10,local_a110);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_a138._M_head_impl + 0x10),"x",1);
                std::ostream::operator<<(local_a138._M_head_impl + 0x10,local_a114);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_a138._M_head_impl + 0x10)," tx_type: ",10);
                __s = *(char **)(libaom_test::tx_type_name + (uVar13 & 0xffffffff) * 8);
                poVar14 = (ostream *)(local_a138._M_head_impl + 0x10);
                if (__s == (char *)0x0) {
                  sVar10 = 6;
                  __s = "(null)";
                }
                else {
                  sVar10 = strlen(__s);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,__s,sVar10);
                if (local_a0e8 == (undefined8 *)0x0) {
                  message = "";
                }
                else {
                  message = (SEARCH_METHODS *)*local_a0e8;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a120,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                           ,0x11f,(char *)message);
                testing::internal::AssertHelper::operator=(&local_a120,(Message *)&local_a138);
                testing::internal::AssertHelper::~AssertHelper(&local_a120);
                if (local_a138._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_a138._M_head_impl + 8))();
                }
                if (local_a0e8 == (undefined8 *)0x0) {
                  return;
                }
                if ((undefined8 *)*local_a0e8 != local_a0e8 + 2) {
                  operator_delete((undefined8 *)*local_a0e8);
                }
                operator_delete(local_a0e8);
                return;
              }
              if (local_a0e8 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_a0e8 != local_a0e8 + 2) {
                  operator_delete((undefined8 *)*local_a0e8);
                }
                operator_delete(puVar5);
              }
              uVar15 = uVar15 + 1;
              rhs = rhs + 1;
              lhs = lhs + 1;
            } while (local_a080 != uVar15);
            uVar13 = local_a0f8 + 1;
            rhs = (int *)((long)local_a098 + local_a0b8);
            lhs = (int *)((long)local_a090 + local_a0b8);
          } while (uVar13 != local_a0b0);
        }
        lVar11 = local_a0c0;
        uVar13 = local_a128;
        iVar34 = local_a12c + 1;
      } while (local_a12c + 1 != 500);
    }
    uVar13 = uVar13 + 1;
    if (uVar13 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

TEST_P(AV1FwdTxfm2dTest, match) {
  AV1FwdTxfm2dMatchTest(GET_PARAM(0), GET_PARAM(1));
}